

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

bool __thiscall ON_TextureMapping::RequiresVertexNormals(ON_TextureMapping *this)

{
  TYPE TVar1;
  bool bVar2;
  
  TVar1 = this->m_type;
  if (TVar1 == srfp_mapping) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if (((this->m_projection != ray_projection) && (TVar1 != box_mapping)) &&
       ((TVar1 != cylinder_mapping || (this->m_bCapped == false)))) {
      return TVar1 == wcsbox_projection;
    }
  }
  return bVar2;
}

Assistant:

bool ON_TextureMapping::RequiresVertexNormals() const
{
  if ( ON_TextureMapping::TYPE::srfp_mapping == m_type )
    return false;

	if(m_projection == ON_TextureMapping::PROJECTION::ray_projection)
    return true;

  if(m_type == ON_TextureMapping::TYPE::box_mapping)
    return true;
	if(m_type == ON_TextureMapping::TYPE::cylinder_mapping && m_bCapped)
    return true;

  if (m_type == ON_TextureMapping::TYPE::wcsbox_projection)
    return true;

	return false;
}